

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O3

double __thiscall
HighsLpRelaxation::computeLPDegneracy(HighsLpRelaxation *this,HighsDomain *localdomain)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  pointer pHVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  dVar12 = 1.0;
  if (((this->lpsolver).solution_.dual_valid == true) && ((this->lpsolver).basis_.valid == true)) {
    dVar12 = (this->lpsolver).info_.super_HighsInfoStruct.max_dual_infeasibility;
    iVar2 = (this->lpsolver).model_.lp_.num_row_;
    iVar8 = 0;
    iVar9 = 0;
    iVar5 = 0;
    iVar6 = 0;
    if (0 < (long)iVar2) {
      pHVar4 = (this->lpsolver).basis_.row_status.
               super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = 0;
      iVar6 = 0;
      iVar5 = 0;
      iVar9 = 0;
      do {
        dVar13 = (this->lpsolver).model_.lp_.row_lower_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar11];
        pdVar1 = (this->lpsolver).model_.lp_.row_upper_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start + lVar11;
        if ((dVar13 != *pdVar1) || (NAN(dVar13) || NAN(*pdVar1))) {
          iVar5 = iVar5 + 1;
          if ((pHVar4[lVar11] != kBasic) &&
             (dVar12 < ABS((this->lpsolver).solution_.row_dual.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar11]))) {
            iVar6 = iVar6 + 1;
          }
        }
        else {
          iVar9 = iVar9 + (uint)(pHVar4[lVar11] == kBasic);
        }
        lVar11 = lVar11 + 1;
      } while (iVar2 != lVar11);
    }
    iVar3 = (this->lpsolver).model_.lp_.num_col_;
    iVar10 = 0;
    if (0 < (long)iVar3) {
      lVar11 = 0;
      iVar8 = 0;
      do {
        if ((this->lpsolver).basis_.col_status.
            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
            super__Vector_impl_data._M_start[lVar11] != kBasic) {
          if (ABS((this->lpsolver).solution_.col_dual.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar11]) <= dVar12) {
            dVar13 = (localdomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[lVar11];
            pdVar1 = (localdomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar11;
            if ((dVar13 == *pdVar1) && (!NAN(dVar13) && !NAN(*pdVar1))) {
              iVar8 = iVar8 + 1;
            }
          }
          else {
            iVar10 = iVar10 + 1;
          }
        }
        lVar11 = lVar11 + 1;
      } while (iVar3 != lVar11);
    }
    iVar7 = (((iVar5 + iVar9) - iVar2) - iVar8) + iVar3;
    if (iVar7 < 1) {
      dVar13 = 0.0;
    }
    else {
      dVar13 = 1.0 - (double)(iVar10 + iVar6) / (double)iVar7;
    }
    dVar12 = 1.0;
    dVar14 = 1.0;
    if (0 < iVar2) {
      dVar14 = (double)(((iVar5 + iVar9) - (iVar6 + iVar8 + iVar10)) + iVar3) / (double)iVar2;
    }
    if (0.8 <= dVar13) {
      dVar12 = pow(10.0,(dVar13 + -0.7) * 10.0);
    }
    dVar12 = (double)(~-(ulong)(dVar14 < 2.0) & (ulong)(dVar14 * 10.0) |
                     (ulong)((uint)(-(ulong)(dVar14 < 2.0) >> 0x20) & 0x3ff00000) << 0x20) * dVar12;
  }
  return dVar12;
}

Assistant:

double HighsLpRelaxation::computeLPDegneracy(
    const HighsDomain& localdomain) const {
  if (!lpsolver.getSolution().dual_valid || !lpsolver.getBasis().valid) {
    return 1.0;
  }

  double dualFeasTol = lpsolver.getInfo().max_dual_infeasibility;

  const HighsBasis& basis = lpsolver.getBasis();
  const HighsSolution& sol = lpsolver.getSolution();

  HighsInt numFixedRows = 0;
  HighsInt numInequalities = 0;
  HighsInt numBasicEqualities = 0;

  for (HighsInt i = 0; i < numRows(); ++i) {
    if (lpsolver.getLp().row_lower_[i] != lpsolver.getLp().row_upper_[i]) {
      ++numInequalities;

      if (basis.row_status[i] != HighsBasisStatus::kBasic) {
        if (std::abs(sol.row_dual[i]) > dualFeasTol) ++numFixedRows;
      }
    } else
      numBasicEqualities += basis.row_status[i] == HighsBasisStatus::kBasic;
  }

  HighsInt numAlreadyFixedCols = 0;
  HighsInt numFixedCols = 0;
  for (HighsInt i = 0; i < numCols(); ++i) {
    if (basis.col_status[i] != HighsBasisStatus::kBasic) {
      if (std::abs(sol.col_dual[i]) > dualFeasTol)
        ++numFixedCols;
      else if (localdomain.col_lower_[i] == localdomain.col_upper_[i])
        ++numAlreadyFixedCols;
    }
  }

  HighsInt base = numCols() - numAlreadyFixedCols + numInequalities +
                  numBasicEqualities - numRows();

  double degenerateColumnShare =
      base > 0 ? 1.0 - double(numFixedCols + numFixedRows) / base : 0.0;

  double varConsRatio =
      numRows() > 0
          ? double(numCols() + numInequalities + numBasicEqualities -
                   numFixedCols - numFixedRows - numAlreadyFixedCols) /
                numRows()
          : 1.0;
  double fac1 = degenerateColumnShare < 0.8
                    ? 1.0
                    : std::pow(10.0, 10 * (degenerateColumnShare - 0.7));
  double fac2 = varConsRatio < 2.0 ? 1.0 : 10.0 * varConsRatio;

  return fac1 * fac2;
}